

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderModifier.cpp
# Opt level: O3

void __thiscall
Assimp::Blender::BlenderModifierShowcase::ApplyModifiers
          (BlenderModifierShowcase *this,aiNode *out,ConversionData *conv_data,Scene *in,
          Object *orig_object)

{
  FileDatabase *pFVar1;
  vector<Assimp::Blender::BlenderModifier*,std::allocator<Assimp::Blender::BlenderModifier*>>
  *pvVar2;
  int iVar3;
  const_iterator cVar4;
  Logger *pLVar5;
  code *pcVar6;
  size_t sVar7;
  pointer ppBVar8;
  long lVar9;
  pointer ppBVar10;
  char *pcVar11;
  long lVar12;
  element_type *peVar13;
  pointer pSVar14;
  fpCreateModifier *pp_Var15;
  BlenderModifier *pBVar16;
  bool bVar17;
  long *local_200 [2];
  long local_1f0 [2];
  ConversionData *local_1e0;
  long local_1d8;
  Object *local_1d0;
  vector<Assimp::Blender::BlenderModifier*,std::allocator<Assimp::Blender::BlenderModifier*>>
  *local_1c8;
  aiNode *local_1c0;
  Scene *local_1b8;
  element_type *local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  peVar13 = (orig_object->modifiers).first.
            super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar13 != (element_type *)0x0) {
    local_1d8 = 0;
    lVar12 = 0;
    local_1e0 = conv_data;
    local_1d0 = orig_object;
    local_1c8 = (vector<Assimp::Blender::BlenderModifier*,std::allocator<Assimp::Blender::BlenderModifier*>>
                 *)this;
    local_1c0 = out;
    local_1b8 = in;
    do {
      pBVar16 = (BlenderModifier *)(local_1a8 + 0x10);
      if (peVar13->dna_type == (char *)0x0) {
        __assert_fail("cur->dna_type",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Blender/BlenderModifier.cpp"
                      ,0x5a,
                      "void Assimp::Blender::BlenderModifierShowcase::ApplyModifiers(aiNode &, ConversionData &, const Scene &, const Object &)"
                     );
      }
      pFVar1 = local_1e0->db;
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,peVar13->dna_type,(allocator<char> *)local_200);
      cVar4 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::find(&(pFVar1->dna).indices._M_t,(key_type *)local_1a8);
      if ((_Rb_tree_header *)cVar4._M_node ==
          &(pFVar1->dna).indices._M_t._M_impl.super__Rb_tree_header) {
        pSVar14 = (pointer)0x0;
      }
      else {
        pSVar14 = (pFVar1->dna).structures.
                  super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                  .
                  super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                  ._M_impl.super__Vector_impl_data._M_start + *(long *)(cVar4._M_node + 2);
      }
      if ((BlenderModifier *)local_1a8._0_8_ != pBVar16) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
      if (pSVar14 == (pointer)0x0) {
        pLVar5 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[44]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [44])"BlendModifier: could not resolve DNA name: ");
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                   &peVar13->dna_type);
        ::std::__cxx11::stringbuf::str();
        Logger::warn(pLVar5,(char *)local_200[0]);
        bVar17 = local_200[0] == local_1f0;
LAB_0046ac29:
        if (!bVar17) {
          operator_delete(local_200[0],local_1f0[0] + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        ::std::ios_base::~ios_base(local_138);
      }
      else {
        local_1a8._0_8_ = pBVar16;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"modifier","");
        cVar4 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::find(&(pSVar14->indices)._M_t,(key_type *)local_1a8);
        if ((_Rb_tree_header *)cVar4._M_node ==
            &(pSVar14->indices)._M_t._M_impl.super__Rb_tree_header) {
          lVar9 = 0;
        }
        else {
          lVar9 = *(long *)(cVar4._M_node + 2) * 0x68 +
                  *(long *)&(pSVar14->fields).
                            super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                            .
                            super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
          ;
        }
        if ((BlenderModifier *)local_1a8._0_8_ != pBVar16) {
          operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
        }
        if ((lVar9 == 0) || (*(long *)(lVar9 + 0x48) != 0)) {
          pLVar5 = DefaultLogger::get();
          pcVar11 = "BlendModifier: expected a `modifier` member at offset 0";
        }
        else {
          pFVar1 = local_1e0->db;
          cVar4 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::find(&(pFVar1->dna).indices._M_t,(key_type *)(lVar9 + 0x20));
          if ((((_Rb_tree_header *)cVar4._M_node !=
                &(pFVar1->dna).indices._M_t._M_impl.super__Rb_tree_header) &&
              (pSVar14 = (pFVar1->dna).structures.
                         super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                         .
                         super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                         ._M_impl.super__Vector_impl_data._M_start, pSVar14 != (pointer)0x0)) &&
             (iVar3 = ::std::__cxx11::string::compare
                                ((char *)(pSVar14 + *(long *)(cVar4._M_node + 2))), iVar3 == 0)) {
            local_1b0 = peVar13 + 1;
            ppBVar10 = *(pointer *)local_1c8;
            ppBVar8 = *(pointer *)(local_1c8 + 8);
            pp_Var15 = creators;
            pcVar6 = god<Assimp::Blender::BlenderModifier_Mirror>;
            do {
              pp_Var15 = pp_Var15 + 1;
              if (ppBVar10 == ppBVar8) {
                local_1a8._0_8_ = (*pcVar6)();
                pvVar2 = local_1c8;
                ::std::
                vector<Assimp::Blender::BlenderModifier*,std::allocator<Assimp::Blender::BlenderModifier*>>
                ::emplace_back<Assimp::Blender::BlenderModifier*>
                          (local_1c8,(BlenderModifier **)local_1a8);
                ppBVar8 = *(pointer *)(pvVar2 + 8);
                ppBVar10 = ppBVar8 + -1;
              }
              pBVar16 = *ppBVar10;
              iVar3 = (*pBVar16->_vptr_BlenderModifier[2])(pBVar16,local_1b0);
              if ((char)iVar3 != '\0') {
                (*pBVar16->_vptr_BlenderModifier[3])
                          (pBVar16,local_1c0,local_1e0,peVar13,local_1b8,local_1d0);
                local_1d8 = local_1d8 + 1;
                goto LAB_0046acf3;
              }
              ppBVar10 = ppBVar10 + 1;
              pcVar6 = *pp_Var15;
            } while (pcVar6 != (fpCreateModifier)0x0);
            pLVar5 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[39]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,(char (*) [39])"Couldn\'t find a handler for modifier: ");
            sVar7 = strlen((char *)&peVar13[4].dna_type);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)&peVar13[4].dna_type,sVar7);
            ::std::__cxx11::stringbuf::str();
            Logger::warn(pLVar5,(char *)local_200[0]);
            bVar17 = local_200[0] == local_1f0;
            goto LAB_0046ac29;
          }
          pLVar5 = DefaultLogger::get();
          pcVar11 = "BlendModifier: expected a ModifierData structure as first member";
        }
        Logger::warn(pLVar5,pcVar11);
      }
LAB_0046acf3:
      lVar12 = lVar12 + 1;
      peVar13 = (element_type *)peVar13[2]._vptr_ElemBase;
    } while (peVar13 != (element_type *)0x0);
    if (lVar12 != 0) {
      pLVar5 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[35]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [35])"BlendModifier: found handlers for ");
      ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," of ",4);
      ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," modifiers on `",0xf);
      pcVar11 = (local_1d0->id).name;
      sVar7 = strlen(pcVar11);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"`, check log messages above for errors",0x26);
      ::std::__cxx11::stringbuf::str();
      Logger::debug(pLVar5,(char *)local_200[0]);
      if (local_200[0] != local_1f0) {
        operator_delete(local_200[0],local_1f0[0] + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      ::std::ios_base::~ios_base(local_138);
    }
  }
  return;
}

Assistant:

void BlenderModifierShowcase::ApplyModifiers(aiNode& out, ConversionData& conv_data, const Scene& in, const Object& orig_object )
{
    size_t cnt = 0u, ful = 0u;

    // NOTE: this cast is potentially unsafe by design, so we need to perform type checks before
    // we're allowed to dereference the pointers without risking to crash. We might still be
    // invoking UB btw - we're assuming that the ModifierData member of the respective modifier
    // structures is at offset sizeof(vftable) with no padding.
    const SharedModifierData* cur = static_cast<const SharedModifierData *> ( orig_object.modifiers.first.get() );
    for (; cur; cur =  static_cast<const SharedModifierData *> ( cur->modifier.next.get() ), ++ful) {
        ai_assert(cur->dna_type);

        const Structure* s = conv_data.db.dna.Get( cur->dna_type );
        if (!s) {
            ASSIMP_LOG_WARN_F("BlendModifier: could not resolve DNA name: ",cur->dna_type);
            continue;
        }

        // this is a common trait of all XXXMirrorData structures in BlenderDNA
        const Field* f = s->Get("modifier");
        if (!f || f->offset != 0) {
            ASSIMP_LOG_WARN("BlendModifier: expected a `modifier` member at offset 0");
            continue;
        }

        s = conv_data.db.dna.Get( f->type );
        if (!s || s->name != "ModifierData") {
            ASSIMP_LOG_WARN("BlendModifier: expected a ModifierData structure as first member");
            continue;
        }

        // now, we can be sure that we should be fine to dereference *cur* as
        // ModifierData (with the above note).
        const ModifierData& dat = cur->modifier;

        const fpCreateModifier* curgod = creators;
        std::vector< BlenderModifier* >::iterator curmod = cached_modifiers->begin(), endmod = cached_modifiers->end();

        for (;*curgod;++curgod,++curmod) { // allocate modifiers on the fly
            if (curmod == endmod) {
                cached_modifiers->push_back((*curgod)());

                endmod = cached_modifiers->end();
                curmod = endmod-1;
            }

            BlenderModifier* const modifier = *curmod;
            if(modifier->IsActive(dat)) {
                modifier->DoIt(out,conv_data,*static_cast<const ElemBase *>(cur),in,orig_object);
                cnt++;

                curgod = NULL;
                break;
            }
        }
        if (curgod) {
            ASSIMP_LOG_WARN_F("Couldn't find a handler for modifier: ",dat.name);
        }
    }

    // Even though we managed to resolve some or all of the modifiers on this
    // object, we still can't say whether our modifier implementations were
    // able to fully do their job.
    if (ful) {
        ASSIMP_LOG_DEBUG_F("BlendModifier: found handlers for ",cnt," of ",ful," modifiers on `",orig_object.id.name,
            "`, check log messages above for errors");
    }
}